

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

string * __thiscall
llbuild::buildsystem::BuildSystemInvocation::formatDetectedCycle_abi_cxx11_
          (string *__return_storage_ptr__,BuildSystemInvocation *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *cycle)

{
  bool bVar1;
  bool bVar2;
  Kind KVar3;
  reference ppRVar4;
  raw_ostream *prVar5;
  StringRef local_240;
  StringRef local_230;
  StringRef local_220;
  StringRef local_210;
  StringRef local_200;
  StringRef local_1f0;
  StringRef local_1e0;
  StringRef local_1d0;
  StringRef local_1c0;
  StringRef local_1b0;
  undefined1 local_1a0 [8];
  BuildKey key;
  Rule *rule;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *__range1;
  undefined1 local_158 [7];
  bool first;
  raw_svector_ostream os;
  SmallString<256U> message;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *cycle_local;
  
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)&os.OS);
  llvm::raw_svector_ostream::raw_svector_ostream
            ((raw_svector_ostream *)local_158,(SmallVectorImpl<char> *)&os.OS);
  llvm::raw_ostream::operator<<((raw_ostream *)local_158,"cycle detected while building: ");
  bVar1 = true;
  __end1 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::begin
                     ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)this)
  ;
  rule = (Rule *)std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::end
                           ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *
                            )this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
                                     *)&rule), bVar2) {
    ppRVar4 = __gnu_cxx::
              __normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
              ::operator*(&__end1);
    key.key.key.field_2._8_8_ = *ppRVar4;
    if (!bVar1) {
      llvm::raw_ostream::operator<<((raw_ostream *)local_158," -> ");
    }
    BuildKey::fromData((BuildKey *)local_1a0,(KeyType *)(key.key.key.field_2._8_8_ + 8));
    KVar3 = BuildKey::getKind((BuildKey *)local_1a0);
    switch(KVar3) {
    case Command:
      prVar5 = llvm::raw_ostream::operator<<((raw_ostream *)local_158,"command \'");
      local_1b0 = BuildKey::getCommandName((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_1b0);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case CustomTask:
      prVar5 = llvm::raw_ostream::operator<<((raw_ostream *)local_158,"custom task \'");
      local_1c0 = BuildKey::getCustomTaskName((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_1c0);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case DirectoryContents:
      prVar5 = llvm::raw_ostream::operator<<((raw_ostream *)local_158,"directory-contents \'");
      local_1d0 = BuildKey::getDirectoryPath((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_1d0);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case FilteredDirectoryContents:
      prVar5 = llvm::raw_ostream::operator<<
                         ((raw_ostream *)local_158,"filtered-directory-contents \'");
      local_1e0 = BuildKey::getFilteredDirectoryPath((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_1e0);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case DirectoryTreeSignature:
      prVar5 = llvm::raw_ostream::operator<<((raw_ostream *)local_158,"directory-tree-signature \'")
      ;
      local_1f0 = BuildKey::getDirectoryTreeSignaturePath((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_1f0);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case DirectoryTreeStructureSignature:
      prVar5 = llvm::raw_ostream::operator<<
                         ((raw_ostream *)local_158,"directory-tree-structure-signature \'");
      local_200 = BuildKey::getFilteredDirectoryPath((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_200);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case Node:
      prVar5 = llvm::raw_ostream::operator<<((raw_ostream *)local_158,"node \'");
      local_210 = BuildKey::getNodeName((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_210);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case Stat:
      prVar5 = llvm::raw_ostream::operator<<((raw_ostream *)local_158,"stat \'");
      local_220 = BuildKey::getStatName((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_220);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case Target:
      prVar5 = llvm::raw_ostream::operator<<((raw_ostream *)local_158,"target \'");
      local_230 = BuildKey::getTargetName((BuildKey *)local_1a0);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,local_230);
      llvm::raw_ostream::operator<<(prVar5,"\'");
      break;
    case Unknown:
      llvm::raw_ostream::operator<<((raw_ostream *)local_158,"((unknown))");
    }
    bVar1 = false;
    BuildKey::~BuildKey((BuildKey *)local_1a0);
    __gnu_cxx::
    __normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
    ::operator++(&__end1);
  }
  local_240 = llvm::raw_svector_ostream::str((raw_svector_ostream *)local_158);
  llvm::StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_240);
  llvm::raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_158);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)&os.OS);
  return __return_storage_ptr__;
}

Assistant:

std::string BuildSystemInvocation::formatDetectedCycle(const std::vector<core::Rule*>& cycle) {
  // Compute a description of the cycle path.
  SmallString<256> message;
  llvm::raw_svector_ostream os(message);
  os << "cycle detected while building: ";
  bool first = true;
  for (const auto* rule: cycle) {
    if (!first)
      os << " -> ";

    // Convert to a build key.
    auto key = BuildKey::fromData(rule->key);
    switch (key.getKind()) {
      case BuildKey::Kind::Unknown:
        os << "((unknown))";
        break;
      case BuildKey::Kind::Command:
        os << "command '" << key.getCommandName() << "'";
        break;
      case BuildKey::Kind::CustomTask:
        os << "custom task '" << key.getCustomTaskName() << "'";
        break;
      case BuildKey::Kind::DirectoryContents:
        os << "directory-contents '" << key.getDirectoryPath() << "'";
        break;
      case BuildKey::Kind::FilteredDirectoryContents:
        os << "filtered-directory-contents '"
        << key.getFilteredDirectoryPath() << "'";
        break;
      case BuildKey::Kind::DirectoryTreeSignature:
        os << "directory-tree-signature '"
        << key.getDirectoryTreeSignaturePath() << "'";
        break;
      case BuildKey::Kind::DirectoryTreeStructureSignature:
        os << "directory-tree-structure-signature '"
        << key.getFilteredDirectoryPath() << "'";
        break;
      case BuildKey::Kind::Node:
        os << "node '" << key.getNodeName() << "'";
        break;
      case BuildKey::Kind::Stat:
        os << "stat '" << key.getStatName() << "'";
        break;
      case BuildKey::Kind::Target:
        os << "target '" << key.getTargetName() << "'";
        break;
    }
    first = false;
  }

  return os.str().str();
}